

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::ClearDependencyInformation(cmTarget *this,cmMakefile *mf)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  string depname;
  string local_90;
  cmAlphaNum local_70;
  cmAlphaNum local_40;
  
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  local_40.View_._M_str = ((_Var1._M_head_impl)->Name)._M_dataplus._M_p;
  local_40.View_._M_len = *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8);
  local_70.View_._M_len = 0xc;
  local_70.View_._M_str = "_LIB_DEPENDS";
  cmStrCat<>(&local_90,&local_40,&local_70);
  cmMakefile::RemoveCacheDefinition(mf,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void cmTarget::ClearDependencyInformation(cmMakefile& mf) const
{
  std::string depname = cmStrCat(this->GetName(), "_LIB_DEPENDS");
  mf.RemoveCacheDefinition(depname);
}